

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t do_helper_mvc(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src,
                      uintptr_t ra)

{
  uint8_t uVar1;
  _Bool _Var2;
  int mmu_idx_00;
  uint len;
  undefined1 local_e0 [7];
  uint8_t byte;
  S390Access local_b8;
  uint local_8c;
  undefined1 local_88 [4];
  uint32_t i;
  S390Access desta;
  S390Access srca;
  int mmu_idx;
  uintptr_t ra_local;
  uint64_t src_local;
  uint64_t dest_local;
  uint32_t l_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  len = l + 1;
  access_prepare(&local_b8,env,src,len,MMU_DATA_LOAD,mmu_idx_00,ra);
  memcpy(&desta.size1,&local_b8,0x28);
  access_prepare((S390Access *)local_e0,env,dest,len,MMU_DATA_STORE,mmu_idx_00,ra);
  memcpy(local_88,local_e0,0x28);
  if (dest == src + 1) {
    uVar1 = access_get_byte(env,(S390Access *)&desta.size1,0,ra);
    access_memset(env,(S390Access *)local_88,uVar1,ra);
  }
  else {
    _Var2 = is_destructive_overlap(env,dest,src,len);
    if (_Var2) {
      for (local_8c = 0; local_8c < len; local_8c = local_8c + 1) {
        uVar1 = access_get_byte(env,(S390Access *)&desta.size1,local_8c,ra);
        access_set_byte(env,(S390Access *)local_88,local_8c,uVar1,ra);
      }
    }
    else {
      access_memmove(env,(S390Access *)local_88,(S390Access *)&desta.size1,ra);
    }
  }
  return env->cc_op;
}

Assistant:

static uint32_t do_helper_mvc(CPUS390XState *env, uint32_t l, uint64_t dest,
                              uint64_t src, uintptr_t ra)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    S390Access srca, desta;
    uint32_t i;

    HELPER_LOG("%s l %d dest %" PRIx64 " src %" PRIx64 "\n",
               __func__, l, dest, src);

    /* MVC always copies one more byte than specified - maximum is 256 */
    l++;

    srca = access_prepare(env, src, l, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, l, MMU_DATA_STORE, mmu_idx, ra);

    /*
     * "When the operands overlap, the result is obtained as if the operands
     * were processed one byte at a time". Only non-destructive overlaps
     * behave like memmove().
     */
    if (dest == src + 1) {
        access_memset(env, &desta, access_get_byte(env, &srca, 0, ra), ra);
    } else if (!is_destructive_overlap(env, dest, src, l)) {
        access_memmove(env, &desta, &srca, ra);
    } else {
        for (i = 0; i < l; i++) {
            uint8_t byte = access_get_byte(env, &srca, i, ra);

            access_set_byte(env, &desta, i, byte, ra);
        }
    }

    return env->cc_op;
}